

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int openDirectory(char *zFilename,int *pFd)

{
  int iVar1;
  int errcode;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  char local_228 [528];
  
  sqlite3_snprintf(0x200,local_228,"%s",zFilename);
  uVar2 = strlen(local_228);
  do {
    if ((int)uVar2 < 1) {
      if (local_228[0] != '/') {
        local_228[0] = '.';
      }
      pcVar3 = local_228 + 1;
      goto LAB_0012e17d;
    }
    uVar4 = uVar2 & 0xffffffff;
    uVar2 = (ulong)((int)uVar2 - 1);
  } while (local_228[uVar4] != '/');
  pcVar3 = local_228 + uVar4;
LAB_0012e17d:
  *pcVar3 = '\0';
  errcode = 0;
  iVar1 = robust_open(local_228,0,0);
  *pFd = iVar1;
  if (iVar1 < 0) {
    errcode = sqlite3CantopenError(0x8d5b);
    unixLogErrorAtLine(errcode,"openDirectory",local_228,0x8d5b);
  }
  return errcode;
}

Assistant:

static int openDirectory(const char *zFilename, int *pFd){
  int ii;
  int fd = -1;
  char zDirname[MAX_PATHNAME+1];

  sqlite3_snprintf(MAX_PATHNAME, zDirname, "%s", zFilename);
  for(ii=(int)strlen(zDirname); ii>0 && zDirname[ii]!='/'; ii--);
  if( ii>0 ){
    zDirname[ii] = '\0';
  }else{
    if( zDirname[0]!='/' ) zDirname[0] = '.';
    zDirname[1] = 0;
  }
  fd = robust_open(zDirname, O_RDONLY|O_BINARY, 0);
  if( fd>=0 ){
    OSTRACE(("OPENDIR %-3d %s\n", fd, zDirname));
  }
  *pFd = fd;
  if( fd>=0 ) return SQLITE_OK;
  return unixLogError(SQLITE_CANTOPEN_BKPT, "openDirectory", zDirname);
}